

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::operator==
          (Electromagnetic_Emission_PDU *this,Electromagnetic_Emission_PDU *Value)

{
  pointer pEVar1;
  KBOOL KVar2;
  pointer Value_00;
  pointer this_00;
  
  KVar2 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar2) &&
       (KVar2 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_EmittingEntityID,&Value->m_EmittingEntityID), !KVar2)) &&
      (KVar2 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID), !KVar2))
     && ((this->m_ui8StateUpdateIndicator == Value->m_ui8StateUpdateIndicator &&
         (this->m_ui8NumberOfEmissionSystems == Value->m_ui8NumberOfEmissionSystems)))) {
    this_00 = (this->m_vEmissionSystem).
              super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->m_vEmissionSystem).
             super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Value_00 = (Value->m_vEmissionSystem).
               super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pEVar1 - (long)this_00 ==
        (long)(Value->m_vEmissionSystem).
              super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)Value_00) {
      if (this_00 == pEVar1) {
        return true;
      }
      do {
        KVar2 = DATA_TYPE::EmissionSystem::operator==(this_00,Value_00);
        if (!KVar2) break;
        this_00 = this_00 + 1;
        Value_00 = Value_00 + 1;
      } while (this_00 != pEVar1);
      if (KVar2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Electromagnetic_Emission_PDU::operator == ( const Electromagnetic_Emission_PDU & Value ) const
{
    if( Header::operator                !=( Value ) )                           return false;
    if( m_EmittingEntityID              != Value.m_EmittingEntityID )           return false;
    if( m_EventID                       != Value.m_EventID )                    return false;
    if( m_ui8StateUpdateIndicator       != Value.m_ui8StateUpdateIndicator )    return false;
    if( m_ui8NumberOfEmissionSystems    != Value.m_ui8NumberOfEmissionSystems ) return false;
    if( m_vEmissionSystem               != Value.m_vEmissionSystem )            return false;
    return true;
}